

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<14>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<14> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  pointer pvVar1;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_14_hpp:126:39),_const_std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_&>
  _Var2;
  pointer pvVar3;
  int iVar4;
  variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
  *entry;
  bool bVar5;
  int MT;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  double local_78;
  StructureDivision local_70;
  
  local_84 = (this->super_Base).MT_;
  local_78 = (double)(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_80 = (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  pvVar3 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pvVar3 == (this->photons_).
                    super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_8c = MF;
  local_88 = MAT;
  if (bVar5) {
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  }
  else {
    _Var2 = std::
            visit<njoy::ENDFtk::section::Type<14>::LTT()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,njoy::ENDFtk::section::Type<14>::LegendreDistributions,njoy::ENDFtk::section::Type<14>::TabulatedDistributions>const&>
                      ((anon_class_1_0_00000001 *)&local_70,pvVar3 + -1);
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = (long)_Var2;
  }
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)bVar5;
  pvVar3 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = (int)((ulong)((long)pvVar1 - (long)pvVar3) >> 7);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  if (pvVar1 == pvVar3) {
    iVar4 = *(int *)&(this->super_Base).field_0x14;
  }
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = (long)iVar4;
  if (pvVar1 != pvVar3) {
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)((pvVar3->
                             super__Variant_base<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
                             ).
                             super__Move_assign_alias<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
                             .
                             super__Copy_assign_alias<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
                             .
                             super__Move_ctor_alias<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
                             .
                             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
                             .
                             super__Variant_storage_alias<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>
                             ._M_index == '\0');
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
    super__Head_base<5UL,_long,_false>._M_head_impl = (_Head_base<5UL,_long,_false>)(long)iVar4;
  }
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_80;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_78;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_70,it,local_88,local_8c,local_84);
  pvVar3 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->photons_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar3 != pvVar1) {
    do {
      local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
           (long)&local_88;
      local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
      super__Head_base<5UL,_long,_false>._M_head_impl =
           (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)it;
      local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_8c;
      local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = (long)&local_84;
      std::
      visit<njoy::ENDFtk::section::Type<14>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,njoy::ENDFtk::section::Type<14>::LegendreDistributions,njoy::ENDFtk::section::Type<14>::TabulatedDistributions>const&>
                ((anon_class_32_4_f17ee1e6 *)&local_70,pvVar3);
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
  }
  sectionEndRecord(&local_70,local_88,local_8c);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_70,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  int MT = this->MT();
  ControlRecord( this->ZA(), this->AWR(), this->LI(), this->LTT(),
                 this->NK(), this->NI() ).print( it, MAT, MF, MT );
  for ( const auto& entry : this->photons_ ) {

    std::visit( [&] ( const auto& v )
                    { return v.print( it, MAT, MF, MT ); },
                entry );
  }
  SEND( MAT, MF ).print( it );
}